

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.hpp
# Opt level: O0

void __thiscall
asio::detail::
iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>
::iterator_connect_op
          (iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>
           *this,basic_socket<asio::ip::tcp,_asio::any_io_executor> *sock,
          basic_resolver_iterator<asio::ip::tcp> *begin,basic_resolver_iterator<asio::ip::tcp> *end,
          default_connect_condition *connect_condition,
          _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>
          *handler)

{
  element_type *in_RSI;
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>
  *in_RDI;
  default_connect_condition *in_R8;
  undefined8 in_R9;
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>
  *other;
  
  base_from_cancellation_state<std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)>,void>
  ::base_from_cancellation_state<asio::cancellation_filter<(asio::cancellation_type)3>>
            ((base_from_cancellation_state<std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)>,void>
              *)in_RDI,in_R9);
  base_from_connect_condition<asio::detail::default_connect_condition>::base_from_connect_condition
            ((base_from_connect_condition<asio::detail::default_connect_condition> *)in_RDI,in_R8);
  (((values_ptr_type *)&in_RDI->_M_f)->
  super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = in_RSI;
  other = (_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>
           *)&in_RDI->field_0x8;
  ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_RDI,
             (basic_resolver_iterator<asio::ip::tcp> *)other);
  ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<asio::ip::tcp> *)in_RDI,
             (basic_resolver_iterator<asio::ip::tcp> *)other);
  *(undefined4 *)
   &(in_RDI->_M_bound_args).
    super__Tuple_impl<0UL,_std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .
    super__Tuple_impl<1UL,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<1UL,_std::shared_ptr<nuraft::req_msg>,_false>._M_head_impl.
    super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  std::
  _Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>
  ::_Bind(in_RDI,other);
  return;
}

Assistant:

iterator_connect_op(basic_socket<Protocol, Executor>& sock,
        const Iterator& begin, const Iterator& end,
        const ConnectCondition& connect_condition,
        IteratorConnectHandler& handler)
      : base_from_cancellation_state<IteratorConnectHandler>(
          handler, enable_partial_cancellation()),
        base_from_connect_condition<ConnectCondition>(connect_condition),
        socket_(sock),
        iter_(begin),
        end_(end),
        start_(0),
        handler_(ASIO_MOVE_CAST(IteratorConnectHandler)(handler))
    {
    }